

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O1

void remora::bindings::mgemm<double,double,remora::bindings::syrk_block_size<double>>
               (double alpha,ulong mc,ulong nc,size_t kc,long A,long B,double *C,size_t stride1,
               size_t stride2)

{
  double *pdVar1;
  double *pdVar2;
  double *B_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double CTempBlock [32];
  double *local_1f0;
  ulong local_1e8;
  double local_138 [33];
  
  if (7 < nc + 7) {
    local_1e8 = 0;
    uVar4 = nc;
    local_1f0 = C;
    do {
      uVar11 = 8;
      if (uVar4 < 8) {
        uVar11 = uVar4;
      }
      if (3 < mc + 3) {
        B_00 = (double *)(kc * 0x40 * local_1e8 + B);
        uVar10 = 0;
        pdVar6 = local_1f0;
        uVar9 = mc;
        do {
          uVar5 = 4;
          if (uVar9 < 4) {
            uVar5 = uVar9;
          }
          if (mc + uVar10 * -4 < 4 || nc + local_1e8 * -8 < 8) {
            memset(local_138,0,0x100);
            ugemm<remora::bindings::syrk_block_size<double>,double,double>
                      (kc,alpha,(double *)(kc * 0x20 * uVar10 + A),B_00,local_138,8,1);
            if (mc != uVar10 * 4) {
              pdVar1 = local_138;
              lVar3 = 0;
              pdVar2 = pdVar6;
              do {
                if (nc != local_1e8 * 8) {
                  lVar8 = 0;
                  pdVar7 = pdVar2;
                  do {
                    *pdVar7 = pdVar1[lVar8] + *pdVar7;
                    lVar8 = lVar8 + 1;
                    pdVar7 = pdVar7 + stride2;
                  } while (uVar11 + (uVar11 == 0) != lVar8);
                }
                lVar3 = lVar3 + 1;
                pdVar2 = pdVar2 + stride1;
                pdVar1 = pdVar1 + 8;
              } while (lVar3 != uVar5 + (uVar5 == 0));
            }
          }
          else {
            ugemm<remora::bindings::syrk_block_size<double>,double,double>
                      (kc,alpha,(double *)(kc * 0x20 * uVar10 + A),B_00,
                       C + local_1e8 * 8 * stride2 + uVar10 * 4 * stride1,stride1,stride2);
          }
          uVar10 = uVar10 + 1;
          uVar9 = uVar9 - 4;
          pdVar6 = pdVar6 + stride1 * 4;
        } while (uVar10 != mc + 3 >> 2);
      }
      local_1e8 = local_1e8 + 1;
      uVar4 = uVar4 - 8;
      local_1f0 = local_1f0 + stride2 * 8;
    } while (local_1e8 != nc + 7 >> 3);
  }
  return;
}

Assistant:

void mgemm(
	std::size_t mc, std::size_t nc, std::size_t kc, TC alpha,
	T const* A, T const* B, TC *C,
	std::size_t stride1, std::size_t stride2, block_size
){
	static std::size_t const MR = block_size::mr;
	static std::size_t const NR = block_size::nr;
	std::size_t const mp  = (mc+MR-1) / MR;
	std::size_t const np  = (nc+NR-1) / NR;

	for (std::size_t j=0; j<np; ++j) {
		std::size_t const nr = std::min(NR, nc - j*NR);

		for (std::size_t i=0; i<mp; ++i) {
			std::size_t const mr = std::min(MR, mc - i*MR);
			auto CBlockStart = C+i*MR*stride1+j*NR*stride2;
			if (mr==MR && nr==NR) {
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CBlockStart, stride1, stride2
				);
			} else {
				TC CTempBlock[MR*NR];
				std::fill_n(CTempBlock, MR*NR, T(0));
				ugemm<block_size>(
					kc, alpha,
					&A[i*kc*MR], &B[j*kc*NR],
					CTempBlock, NR, 1
				);

				for (std::size_t i0=0; i0<mr; ++i0){
					for (std::size_t j0=0; j0<nr; ++j0) {
						CBlockStart[i0*stride1+j0 * stride2] += CTempBlock[i0*NR+j0];
					}
				}
			}
		}
	}
}